

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64
drwav_read_pcm_frames_s16__ima(drwav *pWav,drwav_uint64 framesToRead,drwav_int16 *pBufferOut)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  bool bVar7;
  drwav_int32 diff;
  drwav_int32 predictor;
  drwav_int32 step;
  drwav_uint8 nibble1;
  drwav_uint8 nibble0;
  drwav_uint8 nibbles [4];
  drwav_uint32 iByte;
  drwav_uint32 iSample;
  drwav_uint8 header_1 [8];
  drwav_uint8 header [4];
  drwav_uint32 iChannel;
  drwav_uint64 totalFramesRead;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_84;
  byte local_74 [4];
  uint local_70;
  uint local_6c;
  short local_68;
  byte local_66;
  short local_64;
  byte local_62;
  short local_60;
  byte local_5e;
  uint local_5c;
  drwav_uint64 local_58;
  long local_50;
  long local_48;
  undefined8 *local_40;
  short *local_30;
  short *local_28;
  short *local_20;
  short *local_18;
  short *local_10;
  short *local_8;
  
  local_58 = 0;
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_40 = in_RDI;
  do {
    bVar7 = false;
    if (local_48 != 0) {
      bVar7 = (ulong)local_40[0x24] < (ulong)local_40[0xf];
    }
    if (!bVar7) {
      return local_58;
    }
    if ((*(int *)(local_40 + 0x36) == 0) && (*(int *)((long)local_40 + 0x15c) == 0)) {
      if (*(short *)(local_40 + 0xe) == 1) {
        lVar6 = (*(code *)*local_40)(local_40[3],&local_60,4);
        if (lVar6 != 4) {
          return local_58;
        }
        *(uint *)((long)local_40 + 0x15c) = *(ushort *)(local_40 + 10) - 4;
        if (0x58 < local_5e) {
          (*(code *)local_40[2])(local_40[3],*(undefined4 *)((long)local_40 + 0x15c),1);
          *(undefined4 *)((long)local_40 + 0x15c) = 0;
          return local_58;
        }
        local_8 = &local_60;
        *(int *)(local_40 + 0x2c) = (int)local_60;
        *(uint *)(local_40 + 0x2d) = (uint)local_5e;
        *(undefined4 *)((long)local_40 + 0x1ac) = *(undefined4 *)(local_40 + 0x2c);
        *(undefined4 *)(local_40 + 0x36) = 1;
        local_10 = local_8;
      }
      else {
        lVar6 = (*(code *)*local_40)(local_40[3],&local_68,8);
        if (lVar6 != 8) {
          return local_58;
        }
        *(uint *)((long)local_40 + 0x15c) = *(ushort *)(local_40 + 10) - 8;
        if ((0x58 < local_66) || (0x58 < local_62)) {
          (*(code *)local_40[2])(local_40[3],*(undefined4 *)((long)local_40 + 0x15c),1);
          *(undefined4 *)((long)local_40 + 0x15c) = 0;
          return local_58;
        }
        local_18 = &local_68;
        *(int *)(local_40 + 0x2c) = (int)local_68;
        *(uint *)(local_40 + 0x2d) = (uint)local_66;
        local_28 = &local_64;
        *(int *)((long)local_40 + 0x164) = (int)local_64;
        *(uint *)((long)local_40 + 0x16c) = (uint)local_62;
        *(undefined4 *)(local_40 + 0x35) = *(undefined4 *)(local_40 + 0x2c);
        *(undefined4 *)((long)local_40 + 0x1ac) = *(undefined4 *)((long)local_40 + 0x164);
        *(undefined4 *)(local_40 + 0x36) = 1;
        local_20 = local_18;
        local_30 = local_28;
      }
    }
    while( true ) {
      bVar7 = false;
      if ((local_48 != 0) && (bVar7 = false, *(int *)(local_40 + 0x36) != 0)) {
        bVar7 = (ulong)local_40[0x24] < (ulong)local_40[0xf];
      }
      if (!bVar7) break;
      if (local_50 != 0) {
        for (local_6c = 0; local_6c < *(ushort *)(local_40 + 0xe); local_6c = local_6c + 1) {
          *(short *)(local_50 + (ulong)local_6c * 2) =
               (short)*(undefined4 *)
                       ((long)local_40 +
                       ((0x10 - (ulong)(*(int *)(local_40 + 0x36) *
                                       (uint)*(ushort *)(local_40 + 0xe))) + (ulong)local_6c) * 4 +
                       0x170);
        }
        local_50 = local_50 + (long)(int)(uint)*(ushort *)(local_40 + 0xe) * 2;
      }
      local_48 = local_48 + -1;
      local_58 = local_58 + 1;
      local_40[0x24] = local_40[0x24] + 1;
      *(int *)(local_40 + 0x36) = *(int *)(local_40 + 0x36) + -1;
    }
    if (local_48 == 0) {
      return local_58;
    }
    if ((*(int *)(local_40 + 0x36) == 0) && (*(int *)((long)local_40 + 0x15c) != 0)) {
      *(undefined4 *)(local_40 + 0x36) = 8;
      for (local_5c = 0; local_5c < *(ushort *)(local_40 + 0xe); local_5c = local_5c + 1) {
        lVar6 = (*(code *)*local_40)(local_40[3],local_74,4);
        if (lVar6 != 4) {
          *(undefined4 *)(local_40 + 0x36) = 0;
          return local_58;
        }
        *(int *)((long)local_40 + 0x15c) = *(int *)((long)local_40 + 0x15c) + -4;
        for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
          bVar1 = local_74[local_70];
          bVar3 = bVar1 & 0xf;
          uVar5 = (int)(local_74[local_70] & 0xf0) >> 4;
          bVar4 = (byte)uVar5;
          iVar2 = drwav_read_pcm_frames_s16__ima::stepTable
                  [*(int *)((long)local_40 + (ulong)local_5c * 4 + 0x168)];
          local_94 = *(int *)((long)local_40 + (ulong)local_5c * 4 + 0x160);
          local_84 = iVar2 >> 3;
          if ((bVar1 & 1) != 0) {
            local_84 = (iVar2 >> 2) + local_84;
          }
          if ((bVar1 & 2) != 0) {
            local_84 = (iVar2 >> 1) + local_84;
          }
          if ((bVar1 & 4) != 0) {
            local_84 = iVar2 + local_84;
          }
          if ((bVar1 & 8) != 0) {
            local_84 = -local_84;
          }
          if (local_94 + local_84 < 0x8000) {
            local_8c = local_94 + local_84;
          }
          else {
            local_8c = 0x7fff;
          }
          if (local_8c < -0x8000) {
            local_90 = -0x8000;
          }
          else {
            if (local_94 + local_84 < 0x8000) {
              local_94 = local_94 + local_84;
            }
            else {
              local_94 = 0x7fff;
            }
            local_90 = local_94;
          }
          *(int *)((long)local_40 + (ulong)local_5c * 4 + 0x160) = local_90;
          if (*(int *)((long)local_40 + (ulong)local_5c * 4 + 0x168) +
              drwav_read_pcm_frames_s16__ima::indexTable[bVar3] < 0x59) {
            local_98 = *(int *)((long)local_40 + (ulong)local_5c * 4 + 0x168) +
                       drwav_read_pcm_frames_s16__ima::indexTable[bVar3];
          }
          else {
            local_98 = 0x58;
          }
          if (local_98 < 0) {
            local_9c = 0;
          }
          else {
            if (*(int *)((long)local_40 + (ulong)local_5c * 4 + 0x168) +
                drwav_read_pcm_frames_s16__ima::indexTable[bVar3] < 0x59) {
              local_a0 = *(int *)((long)local_40 + (ulong)local_5c * 4 + 0x168) +
                         drwav_read_pcm_frames_s16__ima::indexTable[bVar3];
            }
            else {
              local_a0 = 0x58;
            }
            local_9c = local_a0;
          }
          *(int *)((long)local_40 + (ulong)local_5c * 4 + 0x168) = local_9c;
          *(int *)((long)local_40 +
                  ((0x10 - (ulong)(*(int *)(local_40 + 0x36) * (uint)*(ushort *)(local_40 + 0xe))) +
                   (ulong)(local_70 * 2 * (uint)*(ushort *)(local_40 + 0xe)) + (ulong)local_5c) * 4
                  + 0x170) = local_90;
          iVar2 = drwav_read_pcm_frames_s16__ima::stepTable
                  [*(int *)((long)local_40 + (ulong)local_5c * 4 + 0x168)];
          local_ac = *(int *)((long)local_40 + (ulong)local_5c * 4 + 0x160);
          local_84 = iVar2 >> 3;
          if ((uVar5 & 1) != 0) {
            local_84 = (iVar2 >> 2) + local_84;
          }
          if ((uVar5 & 2) != 0) {
            local_84 = (iVar2 >> 1) + local_84;
          }
          if ((uVar5 & 4) != 0) {
            local_84 = iVar2 + local_84;
          }
          if ((uVar5 & 8) != 0) {
            local_84 = -local_84;
          }
          if (local_ac + local_84 < 0x8000) {
            local_a4 = local_ac + local_84;
          }
          else {
            local_a4 = 0x7fff;
          }
          if (local_a4 < -0x8000) {
            local_a8 = -0x8000;
          }
          else {
            if (local_ac + local_84 < 0x8000) {
              local_ac = local_ac + local_84;
            }
            else {
              local_ac = 0x7fff;
            }
            local_a8 = local_ac;
          }
          *(int *)((long)local_40 + (ulong)local_5c * 4 + 0x160) = local_a8;
          if (*(int *)((long)local_40 + (ulong)local_5c * 4 + 0x168) +
              drwav_read_pcm_frames_s16__ima::indexTable[bVar4] < 0x59) {
            local_b0 = *(int *)((long)local_40 + (ulong)local_5c * 4 + 0x168) +
                       drwav_read_pcm_frames_s16__ima::indexTable[bVar4];
          }
          else {
            local_b0 = 0x58;
          }
          if (local_b0 < 0) {
            local_b4 = 0;
          }
          else {
            if (*(int *)((long)local_40 + (ulong)local_5c * 4 + 0x168) +
                drwav_read_pcm_frames_s16__ima::indexTable[bVar4] < 0x59) {
              local_b8 = *(int *)((long)local_40 + (ulong)local_5c * 4 + 0x168) +
                         drwav_read_pcm_frames_s16__ima::indexTable[bVar4];
            }
            else {
              local_b8 = 0x58;
            }
            local_b4 = local_b8;
          }
          *(int *)((long)local_40 + (ulong)local_5c * 4 + 0x168) = local_b4;
          *(int *)((long)local_40 +
                  ((0x10 - (ulong)(*(int *)(local_40 + 0x36) * (uint)*(ushort *)(local_40 + 0xe))) +
                   (ulong)((local_70 * 2 + 1) * (uint)*(ushort *)(local_40 + 0xe)) + (ulong)local_5c
                  ) * 4 + 0x170) = local_a8;
        }
      }
    }
  } while( true );
}

Assistant:

static drwav_uint64 drwav_read_pcm_frames_s16__ima(drwav* pWav, drwav_uint64 framesToRead, drwav_int16* pBufferOut)
{
    drwav_uint64 totalFramesRead = 0;
    drwav_uint32 iChannel;

    static drwav_int32 indexTable[16] = {
        -1, -1, -1, -1, 2, 4, 6, 8,
        -1, -1, -1, -1, 2, 4, 6, 8
    };

    static drwav_int32 stepTable[89] = {
        7,     8,     9,     10,    11,    12,    13,    14,    16,    17, 
        19,    21,    23,    25,    28,    31,    34,    37,    41,    45, 
        50,    55,    60,    66,    73,    80,    88,    97,    107,   118, 
        130,   143,   157,   173,   190,   209,   230,   253,   279,   307,
        337,   371,   408,   449,   494,   544,   598,   658,   724,   796,
        876,   963,   1060,  1166,  1282,  1411,  1552,  1707,  1878,  2066, 
        2272,  2499,  2749,  3024,  3327,  3660,  4026,  4428,  4871,  5358,
        5894,  6484,  7132,  7845,  8630,  9493,  10442, 11487, 12635, 13899, 
        15289, 16818, 18500, 20350, 22385, 24623, 27086, 29794, 32767 
    };

    DRWAV_ASSERT(pWav != NULL);
    DRWAV_ASSERT(framesToRead > 0);

    /* TODO: Lots of room for optimization here. */

    while (framesToRead > 0 && pWav->compressed.iCurrentPCMFrame < pWav->totalPCMFrameCount) {
        /* If there are no cached samples we need to load a new block. */
        if (pWav->ima.cachedFrameCount == 0 && pWav->ima.bytesRemainingInBlock == 0) {
            if (pWav->channels == 1) {
                /* Mono. */
                drwav_uint8 header[4];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);

                if (header[2] >= drwav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, drwav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead; /* Invalid data. */
                }

                pWav->ima.predictor[0] = drwav__bytes_to_s16(header + 0);
                pWav->ima.stepIndex[0] = header[2];
                pWav->ima.cachedFrames[drwav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[0];
                pWav->ima.cachedFrameCount = 1;
            } else {
                /* Stereo. */
                drwav_uint8 header[8];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);

                if (header[2] >= drwav_countof(stepTable) || header[6] >= drwav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, drwav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead; /* Invalid data. */
                }

                pWav->ima.predictor[0] = drwav__bytes_to_s16(header + 0);
                pWav->ima.stepIndex[0] = header[2];
                pWav->ima.predictor[1] = drwav__bytes_to_s16(header + 4);
                pWav->ima.stepIndex[1] = header[6];

                pWav->ima.cachedFrames[drwav_countof(pWav->ima.cachedFrames) - 2] = pWav->ima.predictor[0];
                pWav->ima.cachedFrames[drwav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[1];
                pWav->ima.cachedFrameCount = 1;
            }
        }

        /* Output anything that's cached. */
        while (framesToRead > 0 && pWav->ima.cachedFrameCount > 0 && pWav->compressed.iCurrentPCMFrame < pWav->totalPCMFrameCount) {
            if (pBufferOut != NULL) {
                drwav_uint32 iSample;
                for (iSample = 0; iSample < pWav->channels; iSample += 1) {
                    pBufferOut[iSample] = (drwav_int16)pWav->ima.cachedFrames[(drwav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + iSample];
                }
                pBufferOut += pWav->channels;
            }

            framesToRead    -= 1;
            totalFramesRead += 1;
            pWav->compressed.iCurrentPCMFrame += 1;
            pWav->ima.cachedFrameCount -= 1;
        }

        if (framesToRead == 0) {
            return totalFramesRead;
        }

        /*
        If there's nothing left in the cache, just go ahead and load more. If there's nothing left to load in the current block we just continue to the next
        loop iteration which will trigger the loading of a new block.
        */
        if (pWav->ima.cachedFrameCount == 0) {
            if (pWav->ima.bytesRemainingInBlock == 0) {
                continue;
            } else {
                /*
                From what I can tell with stereo streams, it looks like every 4 bytes (8 samples) is for one channel. So it goes 4 bytes for the
                left channel, 4 bytes for the right channel.
                */
                pWav->ima.cachedFrameCount = 8;
                for (iChannel = 0; iChannel < pWav->channels; ++iChannel) {
                    drwav_uint32 iByte;
                    drwav_uint8 nibbles[4];
                    if (pWav->onRead(pWav->pUserData, &nibbles, 4) != 4) {
                        pWav->ima.cachedFrameCount = 0;
                        return totalFramesRead;
                    }
                    pWav->ima.bytesRemainingInBlock -= 4;

                    for (iByte = 0; iByte < 4; ++iByte) {
                        drwav_uint8 nibble0 = ((nibbles[iByte] & 0x0F) >> 0);
                        drwav_uint8 nibble1 = ((nibbles[iByte] & 0xF0) >> 4);

                        drwav_int32 step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        drwav_int32 predictor = pWav->ima.predictor[iChannel];

                        drwav_int32      diff  = step >> 3;
                        if (nibble0 & 1) diff += step >> 2;
                        if (nibble0 & 2) diff += step >> 1;
                        if (nibble0 & 4) diff += step;
                        if (nibble0 & 8) diff  = -diff;

                        predictor = drwav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = drwav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble0], 0, (drwav_int32)drwav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(drwav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+0)*pWav->channels + iChannel] = predictor;


                        step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        predictor = pWav->ima.predictor[iChannel];

                                         diff  = step >> 3;
                        if (nibble1 & 1) diff += step >> 2;
                        if (nibble1 & 2) diff += step >> 1;
                        if (nibble1 & 4) diff += step;
                        if (nibble1 & 8) diff  = -diff;

                        predictor = drwav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = drwav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble1], 0, (drwav_int32)drwav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(drwav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+1)*pWav->channels + iChannel] = predictor;
                    }
                }
            }
        }
    }

    return totalFramesRead;
}